

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_pack(lua_State *L)

{
  KOption KVar1;
  char *pcVar2;
  int iVar3;
  int local_2098;
  int size;
  size_t len;
  char *fmt;
  Header h;
  luaL_Buffer b;
  
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  h.islittle = 1;
  h.maxalign = 1;
  fmt = pcVar2;
  h.L = L;
  lua_pushnil(L);
  luaL_buffinit(L,&b);
  if (*pcVar2 != '\0') {
    KVar1 = getdetails(&h,0,&fmt,&size,&local_2098);
    for (iVar3 = local_2098; 0 < iVar3; iVar3 = iVar3 + -1) {
      if (b.size <= b.n) {
        luaL_prepbuffsize(&b,1);
      }
      b.b[b.n] = '\0';
      b.n = b.n + 1;
    }
    iVar3 = (*(code *)(&DAT_001226d4 + *(int *)(&DAT_001226d4 + (ulong)KVar1 * 4)))();
    return iVar3;
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int str_pack(lua_State *L) {
    luaL_Buffer b;
    Header h;
    const char *fmt = luaL_checkstring(L, 1);  /* format string */
    int arg = 1;  /* current argument to pack */
    size_t totalsize = 0;  /* accumulate total size of result */
    initheader(L, &h);
    lua_pushnil(L);  /* mark to separate arguments from string buffer */
    luaL_buffinit(L, &b);
    while (*fmt != '\0') {
        int size, ntoalign;
        KOption opt = getdetails(&h, totalsize, &fmt, &size, &ntoalign);
        totalsize += ntoalign + size;
        while (ntoalign-- > 0)
            luaL_addchar(&b, LUAL_PACKPADBYTE);  /* fill alignment */
        arg++;
        switch (opt) {
            case Kint: {  /* signed integers */
                lua_Integer n = luaL_checkinteger(L, arg);
                if (size < SZINT) {  /* need overflow check? */
                    lua_Integer lim = (lua_Integer) 1 << ((size * NB) - 1);
                    luaL_argcheck(L, -lim <= n && n < lim, arg, "integer overflow");
                }
                packint(&b, (lua_Unsigned) n, h.islittle, size, (n < 0));
                break;
            }
            case Kuint: {  /* unsigned integers */
                lua_Integer n = luaL_checkinteger(L, arg);
                if (size < SZINT)  /* need overflow check? */
                    luaL_argcheck(L, (lua_Unsigned) n < ((lua_Unsigned) 1 << (size * NB)),
                                  arg, "unsigned overflow");
                packint(&b, (lua_Unsigned) n, h.islittle, size, 0);
                break;
            }
            case Kfloat: {  /* floating-point options */
                volatile Ftypes u;
                char *buff = luaL_prepbuffsize(&b, size);
                lua_Number n = luaL_checknumber(L, arg);  /* get argument */
                if (size == sizeof(u.f)) u.f = (float) n;  /* copy it into 'u' */
                else if (size == sizeof(u.d)) u.d = (double) n;
                else u.n = n;
                /* move 'u' to final result, correcting endianness if needed */
                copywithendian(buff, u.buff, size, h.islittle);
                luaL_addsize(&b, size);
                break;
            }
            case Kchar: {  /* fixed-size string */
                size_t len;
                const char *s = luaL_checklstring(L, arg, &len);
                luaL_argcheck(L, len <= (size_t) size, arg,
                              "string longer than given size");
                luaL_addlstring(&b, s, len);  /* add string */
                while (len++ < (size_t) size)  /* pad extra space */
                    luaL_addchar(&b, LUAL_PACKPADBYTE);
                break;
            }
            case Kstring: {  /* strings with length count */
                size_t len;
                const char *s = luaL_checklstring(L, arg, &len);
                luaL_argcheck(L, size >= (int) sizeof(size_t) ||
                                 len < ((size_t) 1 << (size * NB)),
                              arg, "string length does not fit in given size");
                packint(&b, (lua_Unsigned) len, h.islittle, size, 0);  /* pack length */
                luaL_addlstring(&b, s, len);
                totalsize += len;
                break;
            }
            case Kzstr: {  /* zero-terminated string */
                size_t len;
                const char *s = luaL_checklstring(L, arg, &len);
                luaL_argcheck(L, strlen(s) == len, arg, "string contains zeros");
                luaL_addlstring(&b, s, len);
                luaL_addchar(&b, '\0');  /* add zero at the end */
                totalsize += len + 1;
                break;
            }
            case Kpadding:
                luaL_addchar(&b, LUAL_PACKPADBYTE);  /* FALLTHROUGH */
            case Kpaddalign:
            case Knop:
                arg--;  /* undo increment */
                break;
        }
    }
    luaL_pushresult(&b);
    return 1;
}